

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qeventpoint.cpp
# Opt level: O2

void QEventPoint::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  qreal qVar9;
  QPointF QVar10;
  undefined8 uStack_10;
  
  if (_c == WriteProperty) {
    if (_id != 0) {
      return;
    }
    if (*(long *)_o == 0) {
      return;
    }
    *(undefined1 *)(*(long *)_o + 0xdd) = **_a;
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if (0x18 < (uint)_id) {
    return;
  }
  puVar2 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined1 *)(*(long *)_o + 0xdd);
      goto LAB_0029db4c;
    }
    goto LAB_0029db4a;
  case 1:
    if (*(long *)_o != 0) {
      uStack_10 = *(undefined8 *)(*(long *)_o + 8);
      goto LAB_0029daf1;
    }
    goto LAB_0029daef;
  case 2:
    if (*(long *)_o == 0) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = *(undefined4 *)(*(long *)_o + 0xd8);
    }
    *(undefined4 *)puVar2 = uVar5;
    return;
  case 3:
    if (*(long *)_o == 0) {
      uStack_10 = 0xffffffffffffffff;
    }
    else {
      uStack_10 = *(undefined8 *)(*(long *)_o + 0xd0);
    }
    goto LAB_0029daf1;
  case 4:
    if (*(long *)_o != 0) {
      uVar4 = *(undefined1 *)(*(long *)_o + 0xdc);
      goto LAB_0029db4c;
    }
LAB_0029db4a:
    uVar4 = 0;
LAB_0029db4c:
    *(undefined1 *)puVar2 = uVar4;
    return;
  case 5:
    if (*(long *)_o != 0) {
      uStack_10 = *(undefined8 *)(*(long *)_o + 0xb8);
      goto LAB_0029daf1;
    }
    goto LAB_0029daef;
  case 6:
    if (*(long *)_o != 0) {
      uStack_10 = *(undefined8 *)(*(long *)_o + 200);
      goto LAB_0029daf1;
    }
    goto LAB_0029daef;
  case 7:
    if (*(long *)_o != 0) {
      uStack_10 = *(undefined8 *)(*(long *)_o + 0xc0);
      goto LAB_0029daf1;
    }
LAB_0029daef:
    uStack_10 = 0;
LAB_0029daf1:
    *puVar2 = uStack_10;
    return;
  case 8:
    qVar9 = timeHeld((QEventPoint *)_o);
    uVar5 = SUB84(qVar9,0);
    uVar6 = (undefined4)((ulong)qVar9 >> 0x20);
    goto LAB_0029db53;
  case 9:
    if (*(long *)_o != 0) {
      uVar1 = *(undefined8 *)(*(long *)_o + 0x90);
      uVar5 = (undefined4)uVar1;
      uVar6 = (undefined4)((ulong)uVar1 >> 0x20);
      goto LAB_0029db53;
    }
    goto LAB_0029db50;
  case 10:
    if (*(long *)_o != 0) {
      uVar1 = *(undefined8 *)(*(long *)_o + 0x98);
      uVar5 = (undefined4)uVar1;
      uVar6 = (undefined4)((ulong)uVar1 >> 0x20);
      goto LAB_0029db53;
    }
LAB_0029db50:
    uVar5 = 0;
    uVar6 = 0;
LAB_0029db53:
    *puVar2 = CONCAT44(uVar6,uVar5);
    return;
  case 0xb:
    lVar3 = *(long *)_o;
    if (lVar3 == 0) {
      uVar5 = 0;
      uVar6 = 0xbff00000;
      uVar7 = 0;
      uVar8 = 0xbff00000;
    }
    else {
      uVar5 = *(undefined4 *)(lVar3 + 0xa0);
      uVar6 = *(undefined4 *)(lVar3 + 0xa4);
      uVar7 = *(undefined4 *)(lVar3 + 0xa8);
      uVar8 = *(undefined4 *)(lVar3 + 0xac);
    }
    goto LAB_0029db45;
  case 0xc:
    if (*(long *)_o == 0) {
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar1 = *(undefined8 *)(*(long *)_o + 0xb0);
      uVar5 = (undefined4)uVar1;
      uVar6 = (undefined4)((ulong)uVar1 >> 0x20);
    }
    *puVar2 = CONCAT44(uVar6,uVar5);
    return;
  case 0xd:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x30);
      uVar6 = *(undefined4 *)(lVar3 + 0x34);
      uVar7 = *(undefined4 *)(lVar3 + 0x38);
      uVar8 = *(undefined4 *)(lVar3 + 0x3c);
      goto LAB_0029db45;
    }
    break;
  case 0xe:
    QVar10 = pressPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
    goto LAB_0029db29;
  case 0xf:
    QVar10 = grabPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
    goto LAB_0029db29;
  case 0x10:
    QVar10 = lastPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
    goto LAB_0029db29;
  case 0x11:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x40);
      uVar6 = *(undefined4 *)(lVar3 + 0x44);
      uVar7 = *(undefined4 *)(lVar3 + 0x48);
      uVar8 = *(undefined4 *)(lVar3 + 0x4c);
      goto LAB_0029db45;
    }
    break;
  case 0x12:
    QVar10 = scenePressPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
    goto LAB_0029db29;
  case 0x13:
    QVar10 = sceneGrabPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
    goto LAB_0029db29;
  case 0x14:
    QVar10 = sceneLastPosition((QEventPoint *)_o);
    qVar9 = QVar10.yp;
    uVar5 = QVar10.xp._0_4_;
    uVar6 = QVar10.xp._4_4_;
LAB_0029db29:
    *puVar2 = CONCAT44(uVar6,uVar5);
    puVar2[1] = qVar9;
    return;
  case 0x15:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x50);
      uVar6 = *(undefined4 *)(lVar3 + 0x54);
      uVar7 = *(undefined4 *)(lVar3 + 0x58);
      uVar8 = *(undefined4 *)(lVar3 + 0x5c);
      goto LAB_0029db45;
    }
    break;
  case 0x16:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x60);
      uVar6 = *(undefined4 *)(lVar3 + 100);
      uVar7 = *(undefined4 *)(lVar3 + 0x68);
      uVar8 = *(undefined4 *)(lVar3 + 0x6c);
      goto LAB_0029db45;
    }
    break;
  case 0x17:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x70);
      uVar6 = *(undefined4 *)(lVar3 + 0x74);
      uVar7 = *(undefined4 *)(lVar3 + 0x78);
      uVar8 = *(undefined4 *)(lVar3 + 0x7c);
      goto LAB_0029db45;
    }
    break;
  case 0x18:
    lVar3 = *(long *)_o;
    if (lVar3 != 0) {
      uVar5 = *(undefined4 *)(lVar3 + 0x80);
      uVar6 = *(undefined4 *)(lVar3 + 0x84);
      uVar7 = *(undefined4 *)(lVar3 + 0x88);
      uVar8 = *(undefined4 *)(lVar3 + 0x8c);
      goto LAB_0029db45;
    }
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
LAB_0029db45:
  *(undefined4 *)puVar2 = uVar5;
  *(undefined4 *)((long)puVar2 + 4) = uVar6;
  *(undefined4 *)(puVar2 + 1) = uVar7;
  *(undefined4 *)((long)puVar2 + 0xc) = uVar8;
  return;
}

Assistant:

void QEventPoint::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QEventPoint *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isAccepted(); break;
        case 1: *reinterpret_cast<const QPointingDevice**>(_v) = _t->device(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->id(); break;
        case 3: *reinterpret_cast<QPointingDeviceUniqueId*>(_v) = _t->uniqueId(); break;
        case 4: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 5: *reinterpret_cast<ulong*>(_v) = _t->timestamp(); break;
        case 6: *reinterpret_cast<ulong*>(_v) = _t->pressTimestamp(); break;
        case 7: *reinterpret_cast<ulong*>(_v) = _t->lastTimestamp(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->timeHeld(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->pressure(); break;
        case 10: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 11: *reinterpret_cast<QSizeF*>(_v) = _t->ellipseDiameters(); break;
        case 12: *reinterpret_cast<QVector2D*>(_v) = _t->velocity(); break;
        case 13: *reinterpret_cast<QPointF*>(_v) = _t->position(); break;
        case 14: *reinterpret_cast<QPointF*>(_v) = _t->pressPosition(); break;
        case 15: *reinterpret_cast<QPointF*>(_v) = _t->grabPosition(); break;
        case 16: *reinterpret_cast<QPointF*>(_v) = _t->lastPosition(); break;
        case 17: *reinterpret_cast<QPointF*>(_v) = _t->scenePosition(); break;
        case 18: *reinterpret_cast<QPointF*>(_v) = _t->scenePressPosition(); break;
        case 19: *reinterpret_cast<QPointF*>(_v) = _t->sceneGrabPosition(); break;
        case 20: *reinterpret_cast<QPointF*>(_v) = _t->sceneLastPosition(); break;
        case 21: *reinterpret_cast<QPointF*>(_v) = _t->globalPosition(); break;
        case 22: *reinterpret_cast<QPointF*>(_v) = _t->globalPressPosition(); break;
        case 23: *reinterpret_cast<QPointF*>(_v) = _t->globalGrabPosition(); break;
        case 24: *reinterpret_cast<QPointF*>(_v) = _t->globalLastPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAccepted(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}